

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::TrimCapabilitiesPass::HasForbiddenCapabilities(TrimCapabilitiesPass *this)

{
  bool bVar1;
  FeatureManager *pFVar2;
  
  if ((this->forbiddenCapabilities_).size_ != 0) {
    pFVar2 = IRContext::get_feature_mgr((this->super_Pass).context_);
    bVar1 = EnumSet<spv::Capability>::HasAnyOf(&pFVar2->capabilities_,&this->forbiddenCapabilities_)
    ;
    return bVar1;
  }
  return false;
}

Assistant:

bool TrimCapabilitiesPass::HasForbiddenCapabilities() const {
  // EnumSet.HasAnyOf returns `true` if the given set is empty.
  if (forbiddenCapabilities_.size() == 0) {
    return false;
  }

  const auto& capabilities = context()->get_feature_mgr()->GetCapabilities();
  return capabilities.HasAnyOf(forbiddenCapabilities_);
}